

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_suite.cpp
# Opt level: O1

void vector_suite::test_empty(void)

{
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char*,std::equal_to<char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/vector_suite.cpp"
             ,0x40,"void vector_suite::test_empty()",0,0,0,0);
  return;
}

Assistant:

void test_empty()
{
    std::vector<char> output;
    vector_buffer<char> container(output);

    std::array<char, 0> expected;
    TRIAL_PROTOCOL_TEST_ALL_WITH(output.begin(), output.end(),
                                 expected.begin(), expected.end(),
                                 std::equal_to<char>());
}